

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_copy(mbedtls_mpi *X,mbedtls_mpi *Y)

{
  size_t sVar1;
  ulong uVar2;
  int iVar3;
  size_t __n;
  ulong nblimbs;
  
  if (X != Y) {
    if (Y->p == (mbedtls_mpi_uint *)0x0) {
      mbedtls_mpi_free(X);
    }
    else {
      sVar1 = Y->n * 8;
      uVar2 = Y->n;
      do {
        nblimbs = uVar2;
        __n = sVar1;
        if (nblimbs == 1) break;
        sVar1 = __n - 8;
        uVar2 = nblimbs - 1;
      } while (Y->p[nblimbs - 1] == 0);
      X->s = Y->s;
      if (X->n < nblimbs) {
        iVar3 = mbedtls_mpi_grow(X,nblimbs);
        if (iVar3 != 0) {
          return iVar3;
        }
      }
      else {
        memset(X->p + nblimbs,0,(X->n - nblimbs) * 8);
      }
      memcpy(X->p,Y->p,__n);
    }
  }
  return 0;
}

Assistant:

int mbedtls_mpi_copy( mbedtls_mpi *X, const mbedtls_mpi *Y )
{
    int ret = 0;
    size_t i;

    if( X == Y )
        return( 0 );

    if( Y->p == NULL )
    {
        mbedtls_mpi_free( X );
        return( 0 );
    }

    for( i = Y->n - 1; i > 0; i-- )
        if( Y->p[i] != 0 )
            break;
    i++;

    X->s = Y->s;

    if( X->n < i )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, i ) );
    }
    else
    {
        memset( X->p + i, 0, ( X->n - i ) * ciL );
    }

    memcpy( X->p, Y->p, i * ciL );

cleanup:

    return( ret );
}